

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O3

ly_write_clb ly_out_clb(ly_out *out,ly_write_clb writeclb)

{
  FILE *pFVar1;
  char *pcVar2;
  
  if (out == (ly_out *)0x0) {
    pcVar2 = "out";
  }
  else {
    if (out->type == LY_OUT_CALLBACK) {
      pFVar1 = (out->method).f;
      if (writeclb == (ly_write_clb)0x0) {
        return (ly_write_clb)pFVar1;
      }
      (out->method).clb.func = writeclb;
      return (ly_write_clb)pFVar1;
    }
    pcVar2 = "out->type == LY_OUT_CALLBACK";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_out_clb");
  return (ly_write_clb)0x0;
}

Assistant:

LIBYANG_API_DEF ly_write_clb
ly_out_clb(struct ly_out *out, ly_write_clb writeclb)
{
    ly_write_clb prev_clb;

    LY_CHECK_ARG_RET(NULL, out, out->type == LY_OUT_CALLBACK, NULL);

    prev_clb = out->method.clb.func;

    if (writeclb) {
        out->method.clb.func = writeclb;
    }

    return prev_clb;
}